

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O1

rf_mesh * rf_gen_mesh_cubicmap
                    (rf_mesh *__return_storage_ptr__,rf_image cubicmap,rf_vec3 cube_size,
                    rf_allocator allocator,rf_allocator temp_allocator)

{
  undefined8 *puVar1;
  float *pfVar2;
  rf_source_location rVar3;
  rf_source_location rVar4;
  rf_source_location rVar5;
  rf_source_location rVar6;
  rf_source_location rVar7;
  rf_source_location rVar8;
  rf_source_location rVar9;
  rf_source_location rVar10;
  rf_source_location rVar11;
  rf_source_location rVar12;
  rf_source_location rVar13;
  rf_allocator_args rVar14;
  rf_allocator_args rVar15;
  rf_allocator_args rVar16;
  rf_allocator_args rVar17;
  rf_allocator_args rVar18;
  rf_allocator allocator_00;
  rf_image image;
  undefined1 auVar19 [24];
  undefined1 auVar20 [24];
  undefined1 auVar21 [24];
  undefined1 auVar22 [24];
  undefined1 auVar23 [24];
  undefined1 auVar24 [24];
  int iVar25;
  uint *puVar26;
  rf_color *prVar27;
  void *pvVar28;
  void *pvVar29;
  void *pvVar30;
  long lVar31;
  float *pfVar32;
  int iVar33;
  int iVar34;
  long lVar35;
  int iVar36;
  long lVar37;
  long lVar38;
  int iVar39;
  int iVar40;
  long lVar41;
  long lVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  long local_2c8;
  undefined4 in_stack_fffffffffffffd48;
  undefined4 in_stack_fffffffffffffd4c;
  undefined4 in_stack_fffffffffffffd50;
  long local_2a0;
  long local_298;
  uint uStack_264;
  undefined8 in_stack_fffffffffffffdc0;
  undefined4 in_stack_fffffffffffffdc8;
  uint in_stack_fffffffffffffdcc;
  undefined8 in_stack_fffffffffffffdd0;
  uint uStack_204;
  uint uStack_1d4;
  uint uStack_1a4;
  uint uStack_174;
  uint uStack_144;
  uint uStack_114;
  uint uStack_e4;
  uint uStack_b4;
  uint uStack_84;
  float local_68;
  float fStack_64;
  rf_allocator local_50;
  rf_allocator local_40;
  
  local_50.allocator_proc = temp_allocator.allocator_proc;
  local_50.user_data = temp_allocator.user_data;
  local_40.allocator_proc = allocator.allocator_proc;
  local_40.user_data = allocator.user_data;
  fVar43 = cube_size.z;
  *(undefined8 *)&__return_storage_ptr__->vao_id = 0;
  __return_storage_ptr__->vbo_id = (uint *)0x0;
  __return_storage_ptr__->bone_ids = (int *)0x0;
  __return_storage_ptr__->bone_weights = (float *)0x0;
  __return_storage_ptr__->anim_vertices = (float *)0x0;
  __return_storage_ptr__->anim_normals = (float *)0x0;
  __return_storage_ptr__->colors = (uchar *)0x0;
  __return_storage_ptr__->indices = (unsigned_short *)0x0;
  __return_storage_ptr__->normals = (float *)0x0;
  __return_storage_ptr__->tangents = (float *)0x0;
  __return_storage_ptr__->texcoords = (float *)0x0;
  __return_storage_ptr__->texcoords2 = (float *)0x0;
  __return_storage_ptr__->vertex_count = 0;
  __return_storage_ptr__->triangle_count = 0;
  __return_storage_ptr__->vertices = (float *)0x0;
  rVar3.proc_name = "rf_gen_mesh_cubicmap";
  rVar3.file_name =
       "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  rVar3.line_in_file = 0x898b;
  rVar14._16_8_ = (ulong)uStack_84 << 0x20;
  rVar14.pointer_to_free_or_realloc = (void *)SUB168(ZEXT816(0x1c) << 0x40,0);
  rVar14.size_to_allocate_or_reallocate = SUB168(ZEXT816(0x1c) << 0x40,8);
  puVar26 = (uint *)(*local_40.allocator_proc)(&local_40,rVar3,RF_AM_ALLOC,rVar14);
  __return_storage_ptr__->vbo_id = puVar26;
  puVar26[0] = 0;
  puVar26[1] = 0;
  puVar26[2] = 0;
  puVar26[3] = 0;
  puVar26[3] = 0;
  puVar26[4] = 0;
  puVar26[5] = 0;
  puVar26[6] = 0;
  image.width = in_stack_fffffffffffffdc8;
  image.data = (void *)in_stack_fffffffffffffdc0;
  image.height = in_stack_fffffffffffffdcc;
  image.format = (int)in_stack_fffffffffffffdd0;
  image.valid = (_Bool)(char)((ulong)in_stack_fffffffffffffdd0 >> 0x20);
  image._21_3_ = (int3)((ulong)in_stack_fffffffffffffdd0 >> 0x28);
  allocator_00.user_data._4_4_ = in_stack_fffffffffffffd4c;
  allocator_00.user_data._0_4_ = in_stack_fffffffffffffd48;
  allocator_00.allocator_proc._0_4_ = in_stack_fffffffffffffd50;
  allocator_00.allocator_proc._4_4_ = fVar43;
  prVar27 = rf_image_pixels_to_rgba32(image,allocator_00);
  lVar41 = (long)(cubicmap.height * cubicmap.width * 0x24);
  lVar38 = lVar41 * 0xc;
  rVar4.proc_name = "rf_gen_mesh_cubicmap";
  rVar4.file_name =
       "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  rVar4.line_in_file = 0x899e;
  auVar19._8_8_ = (ulong)uStack_b4 << 0x20;
  auVar19._0_8_ = lVar38;
  auVar19._16_8_ = 0;
  pvVar28 = (*local_50.allocator_proc)
                      (&local_50,rVar4,RF_AM_ALLOC,(rf_allocator_args)(auVar19 << 0x40));
  rVar5.proc_name = "rf_gen_mesh_cubicmap";
  rVar5.file_name =
       "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  rVar5.line_in_file = 0x899f;
  auVar20._8_8_ = (ulong)uStack_e4 << 0x20;
  auVar20._0_8_ = lVar41 << 3;
  auVar20._16_8_ = 0;
  pvVar29 = (*local_50.allocator_proc)
                      (&local_50,rVar5,RF_AM_ALLOC,(rf_allocator_args)(auVar20 << 0x40));
  rVar6.proc_name = "rf_gen_mesh_cubicmap";
  rVar6.file_name =
       "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  rVar6.line_in_file = 0x89a0;
  auVar21._8_8_ = (ulong)uStack_114 << 0x20;
  auVar21._0_8_ = lVar38;
  auVar21._16_8_ = 0;
  pvVar30 = (*local_50.allocator_proc)
                      (&local_50,rVar6,RF_AM_ALLOC,(rf_allocator_args)(auVar21 << 0x40));
  iVar25 = 0;
  iVar39 = 0;
  iVar33 = 0;
  if (0 < (long)cubicmap.height) {
    fStack_64 = cube_size.y;
    local_298 = -4;
    local_2a0 = 4;
    lVar38 = 0;
    iVar33 = 0;
    iVar39 = 0;
    iVar25 = 0;
    local_2c8 = 0;
    do {
      if (0 < cubicmap.width) {
        fVar45 = ((float)local_2c8 + -0.5) * fVar43;
        fVar46 = ((float)local_2c8 + 0.5) * fVar43;
        lVar41 = 0;
        do {
          local_68 = cube_size.x;
          fVar44 = ((float)lVar41 + -0.5) * local_68;
          local_68 = ((float)lVar41 + 0.5) * local_68;
          lVar31 = lVar38 * cubicmap.width;
          if ((&prVar27[lVar41].r)[lVar31] == '\0') {
            if (((&prVar27[lVar41].g)[lVar31] == '\0') && ((&prVar27[lVar41].b)[lVar31] == '\0')) {
              lVar35 = (long)iVar33;
              *(float *)((long)pvVar28 + lVar35 * 0xc) = fVar44;
              *(float *)((long)pvVar28 + lVar35 * 0xc + 4) = fStack_64;
              *(float *)((long)pvVar28 + lVar35 * 0xc + 8) = fVar45;
              *(float *)((long)pvVar28 + lVar35 * 0xc + 0xc) = local_68;
              *(float *)((long)pvVar28 + lVar35 * 0xc + 0x10) = fStack_64;
              *(float *)((long)pvVar28 + lVar35 * 0xc + 0x14) = fVar46;
              *(float *)((long)pvVar28 + lVar35 * 0xc + 0x18) = fVar44;
              *(float *)((long)pvVar28 + lVar35 * 0xc + 0x1c) = fStack_64;
              *(float *)((long)pvVar28 + lVar35 * 0xc + 0x20) = fVar46;
              *(float *)((long)pvVar28 + lVar35 * 0xc + 0x24) = fVar44;
              *(float *)((long)pvVar28 + lVar35 * 0xc + 0x28) = fStack_64;
              *(float *)((long)pvVar28 + lVar35 * 0xc + 0x2c) = fVar45;
              *(float *)((long)pvVar28 + lVar35 * 0xc + 0x30) = local_68;
              *(float *)((long)pvVar28 + lVar35 * 0xc + 0x34) = fStack_64;
              *(float *)((long)pvVar28 + lVar35 * 0xc + 0x38) = fVar45;
              *(float *)((long)pvVar28 + lVar35 * 0xc + 0x3c) = local_68;
              *(float *)((long)pvVar28 + lVar35 * 0xc + 0x40) = fStack_64;
              *(float *)((long)pvVar28 + lVar35 * 0xc + 0x44) = fVar46;
              lVar31 = (long)iVar25 * 0xc;
              *(undefined4 *)((long)pvVar30 + lVar31 + 8) = 0;
              *(undefined8 *)((long)pvVar30 + lVar31) = 0xbf80000000000000;
              *(undefined8 *)((long)pvVar30 + lVar31 + 0xc) = 0xbf80000000000000;
              *(undefined4 *)((long)pvVar30 + lVar31 + 0x14) = 0;
              *(undefined8 *)((long)pvVar30 + lVar31 + 0x18) = 0xbf80000000000000;
              *(undefined4 *)((long)pvVar30 + lVar31 + 0x20) = 0;
              *(undefined8 *)((long)pvVar30 + lVar31 + 0x24) = 0xbf80000000000000;
              *(undefined4 *)((long)pvVar30 + lVar31 + 0x2c) = 0;
              *(undefined8 *)((long)pvVar30 + lVar31 + 0x30) = 0xbf80000000000000;
              *(undefined4 *)((long)pvVar30 + lVar31 + 0x38) = 0;
              *(undefined8 *)((long)pvVar30 + lVar31 + 0x3c) = 0xbf80000000000000;
              *(undefined4 *)((long)pvVar30 + lVar31 + 0x44) = 0;
              lVar42 = (long)iVar39;
              puVar1 = (undefined8 *)((long)pvVar29 + lVar42 * 8);
              *puVar1 = 0x3f00000000000000;
              puVar1[1] = 0x3f8000003f000000;
              puVar1 = (undefined8 *)((long)pvVar29 + lVar42 * 8 + 0x10);
              *puVar1 = 0x3f80000000000000;
              puVar1[1] = 0x3f00000000000000;
              puVar1 = (undefined8 *)((long)pvVar29 + lVar42 * 8 + 0x20);
              *puVar1 = 0x3f0000003f000000;
              puVar1[1] = 0x3f8000003f000000;
              *(float *)((long)pvVar28 + lVar35 * 0xc + 0x48) = fVar44;
              *(undefined4 *)((long)pvVar28 + lVar35 * 0xc + 0x4c) = 0;
              *(float *)((long)pvVar28 + lVar35 * 0xc + 0x50) = fVar45;
              *(float *)((long)pvVar28 + lVar35 * 0xc + 0x54) = fVar44;
              *(undefined4 *)((long)pvVar28 + lVar35 * 0xc + 0x58) = 0;
              *(float *)((long)pvVar28 + lVar35 * 0xc + 0x5c) = fVar46;
              *(float *)((long)pvVar28 + lVar35 * 0xc + 0x60) = local_68;
              *(undefined4 *)((long)pvVar28 + lVar35 * 0xc + 100) = 0;
              *(float *)((long)pvVar28 + lVar35 * 0xc + 0x68) = fVar46;
              *(float *)((long)pvVar28 + lVar35 * 0xc + 0x6c) = fVar44;
              *(undefined4 *)((long)pvVar28 + lVar35 * 0xc + 0x70) = 0;
              *(float *)((long)pvVar28 + lVar35 * 0xc + 0x74) = fVar45;
              *(float *)((long)pvVar28 + lVar35 * 0xc + 0x78) = local_68;
              *(undefined4 *)((long)pvVar28 + lVar35 * 0xc + 0x7c) = 0;
              *(float *)((long)pvVar28 + lVar35 * 0xc + 0x80) = fVar46;
              *(float *)((long)pvVar28 + lVar35 * 0xc + 0x84) = local_68;
              *(undefined4 *)((long)pvVar28 + lVar35 * 0xc + 0x88) = 0;
              *(float *)((long)pvVar28 + lVar35 * 0xc + 0x8c) = fVar45;
              *(undefined4 *)((long)pvVar30 + lVar31 + 0x50) = 0;
              *(undefined8 *)((long)pvVar30 + lVar31 + 0x48) = 0x3f80000000000000;
              *(undefined4 *)((long)pvVar30 + lVar31 + 0x5c) = 0;
              *(undefined8 *)((long)pvVar30 + lVar31 + 0x54) = 0x3f80000000000000;
              *(undefined8 *)((long)pvVar30 + lVar31 + 0x60) = 0x3f80000000000000;
              *(undefined4 *)((long)pvVar30 + lVar31 + 0x68) = 0;
              *(undefined8 *)((long)pvVar30 + lVar31 + 0x6c) = 0x3f80000000000000;
              *(undefined4 *)((long)pvVar30 + lVar31 + 0x74) = 0;
              *(undefined8 *)((long)pvVar30 + lVar31 + 0x78) = 0x3f80000000000000;
              *(undefined4 *)((long)pvVar30 + lVar31 + 0x80) = 0;
              *(undefined8 *)((long)pvVar30 + lVar31 + 0x84) = 0x3f80000000000000;
              *(undefined4 *)((long)pvVar30 + lVar31 + 0x8c) = 0;
              puVar1 = (undefined8 *)((long)pvVar29 + lVar42 * 8 + 0x30);
              *puVar1 = 0x3f0000003f800000;
              puVar1[1] = 0x3f8000003f800000;
              puVar1 = (undefined8 *)((long)pvVar29 + lVar42 * 8 + 0x40);
              *puVar1 = 0x3f8000003f000000;
              puVar1[1] = 0x3f0000003f800000;
              puVar1 = (undefined8 *)((long)pvVar29 + lVar42 * 8 + 0x50);
              *puVar1 = 0x3f8000003f000000;
              puVar1[1] = 0x3f0000003f000000;
              iVar39 = iVar39 + 0xc;
              iVar33 = iVar33 + 0xc;
              iVar25 = iVar25 + 0xc;
            }
          }
          else if ((((&prVar27[lVar41].r)[lVar31] == 0xff) && ((&prVar27[lVar41].g)[lVar31] == 0xff)
                   ) && ((&prVar27[lVar41].b)[lVar31] == 0xff)) {
            lVar35 = (long)iVar33;
            *(float *)((long)pvVar28 + lVar35 * 0xc) = fVar44;
            *(float *)((long)pvVar28 + lVar35 * 0xc + 4) = fStack_64;
            *(float *)((long)pvVar28 + lVar35 * 0xc + 8) = fVar45;
            *(float *)((long)pvVar28 + lVar35 * 0xc + 0xc) = fVar44;
            *(float *)((long)pvVar28 + lVar35 * 0xc + 0x10) = fStack_64;
            *(float *)((long)pvVar28 + lVar35 * 0xc + 0x14) = fVar46;
            *(float *)((long)pvVar28 + lVar35 * 0xc + 0x18) = local_68;
            *(float *)((long)pvVar28 + lVar35 * 0xc + 0x1c) = fStack_64;
            *(float *)((long)pvVar28 + lVar35 * 0xc + 0x20) = fVar46;
            *(float *)((long)pvVar28 + lVar35 * 0xc + 0x24) = fVar44;
            *(float *)((long)pvVar28 + lVar35 * 0xc + 0x28) = fStack_64;
            *(float *)((long)pvVar28 + lVar35 * 0xc + 0x2c) = fVar45;
            *(float *)((long)pvVar28 + lVar35 * 0xc + 0x30) = local_68;
            *(float *)((long)pvVar28 + lVar35 * 0xc + 0x34) = fStack_64;
            *(float *)((long)pvVar28 + lVar35 * 0xc + 0x38) = fVar46;
            *(float *)((long)pvVar28 + lVar35 * 0xc + 0x3c) = local_68;
            *(float *)((long)pvVar28 + lVar35 * 0xc + 0x40) = fStack_64;
            *(float *)((long)pvVar28 + lVar35 * 0xc + 0x44) = fVar45;
            lVar31 = (long)iVar25 * 0xc;
            *(undefined4 *)((long)pvVar30 + lVar31 + 8) = 0;
            *(undefined8 *)((long)pvVar30 + lVar31) = 0x3f80000000000000;
            *(undefined8 *)((long)pvVar30 + lVar31 + 0xc) = 0x3f80000000000000;
            *(undefined4 *)((long)pvVar30 + lVar31 + 0x14) = 0;
            *(undefined8 *)((long)pvVar30 + lVar31 + 0x18) = 0x3f80000000000000;
            *(undefined4 *)((long)pvVar30 + lVar31 + 0x20) = 0;
            *(undefined8 *)((long)pvVar30 + lVar31 + 0x24) = 0x3f80000000000000;
            *(undefined4 *)((long)pvVar30 + lVar31 + 0x2c) = 0;
            *(undefined8 *)((long)pvVar30 + lVar31 + 0x30) = 0x3f80000000000000;
            *(undefined4 *)((long)pvVar30 + lVar31 + 0x38) = 0;
            *(undefined8 *)((long)pvVar30 + lVar31 + 0x3c) = 0x3f80000000000000;
            *(undefined4 *)((long)pvVar30 + lVar31 + 0x44) = 0;
            lVar42 = (long)iVar39;
            puVar1 = (undefined8 *)((long)pvVar29 + lVar42 * 8);
            *puVar1 = 0x3f00000000000000;
            puVar1[1] = 0x3f80000000000000;
            puVar1 = (undefined8 *)((long)pvVar29 + lVar42 * 8 + 0x10);
            *puVar1 = 0x3f8000003f000000;
            puVar1[1] = 0x3f00000000000000;
            puVar1 = (undefined8 *)((long)pvVar29 + lVar42 * 8 + 0x20);
            *puVar1 = 0x3f8000003f000000;
            puVar1[1] = 0x3f0000003f000000;
            *(float *)((long)pvVar28 + lVar35 * 0xc + 0x48) = fVar44;
            *(undefined4 *)((long)pvVar28 + lVar35 * 0xc + 0x4c) = 0;
            *(float *)((long)pvVar28 + lVar35 * 0xc + 0x50) = fVar45;
            *(float *)((long)pvVar28 + lVar35 * 0xc + 0x54) = local_68;
            *(undefined4 *)((long)pvVar28 + lVar35 * 0xc + 0x58) = 0;
            *(float *)((long)pvVar28 + lVar35 * 0xc + 0x5c) = fVar46;
            *(float *)((long)pvVar28 + lVar35 * 0xc + 0x60) = fVar44;
            *(undefined4 *)((long)pvVar28 + lVar35 * 0xc + 100) = 0;
            *(float *)((long)pvVar28 + lVar35 * 0xc + 0x68) = fVar46;
            *(float *)((long)pvVar28 + lVar35 * 0xc + 0x6c) = fVar44;
            *(undefined4 *)((long)pvVar28 + lVar35 * 0xc + 0x70) = 0;
            *(float *)((long)pvVar28 + lVar35 * 0xc + 0x74) = fVar45;
            *(float *)((long)pvVar28 + lVar35 * 0xc + 0x78) = local_68;
            *(undefined4 *)((long)pvVar28 + lVar35 * 0xc + 0x7c) = 0;
            *(float *)((long)pvVar28 + lVar35 * 0xc + 0x80) = fVar45;
            *(float *)((long)pvVar28 + lVar35 * 0xc + 0x84) = local_68;
            *(undefined4 *)((long)pvVar28 + lVar35 * 0xc + 0x88) = 0;
            *(float *)((long)pvVar28 + lVar35 * 0xc + 0x8c) = fVar46;
            iVar36 = iVar33 + 0xc;
            *(undefined4 *)((long)pvVar30 + lVar31 + 0x50) = 0;
            *(undefined8 *)((long)pvVar30 + lVar31 + 0x48) = 0xbf80000000000000;
            *(undefined4 *)((long)pvVar30 + lVar31 + 0x5c) = 0;
            *(undefined8 *)((long)pvVar30 + lVar31 + 0x54) = 0xbf80000000000000;
            *(undefined8 *)((long)pvVar30 + lVar31 + 0x60) = 0xbf80000000000000;
            *(undefined4 *)((long)pvVar30 + lVar31 + 0x68) = 0;
            *(undefined8 *)((long)pvVar30 + lVar31 + 0x6c) = 0xbf80000000000000;
            *(undefined4 *)((long)pvVar30 + lVar31 + 0x74) = 0;
            *(undefined8 *)((long)pvVar30 + lVar31 + 0x78) = 0xbf80000000000000;
            *(undefined4 *)((long)pvVar30 + lVar31 + 0x80) = 0;
            *(undefined8 *)((long)pvVar30 + lVar31 + 0x84) = 0xbf80000000000000;
            *(undefined4 *)((long)pvVar30 + lVar31 + 0x8c) = 0;
            iVar34 = iVar25 + 0xc;
            puVar1 = (undefined8 *)((long)pvVar29 + lVar42 * 8 + 0x30);
            *puVar1 = 0x3f0000003f800000;
            puVar1[1] = 0x3f8000003f000000;
            puVar1 = (undefined8 *)((long)pvVar29 + lVar42 * 8 + 0x40);
            *puVar1 = 0x3f8000003f800000;
            puVar1[1] = 0x3f0000003f800000;
            puVar1 = (undefined8 *)((long)pvVar29 + lVar42 * 8 + 0x50);
            *puVar1 = 0x3f0000003f000000;
            puVar1[1] = 0x3f8000003f000000;
            iVar40 = iVar39 + 0xc;
            if (((local_2c8 < (long)cubicmap.height + -1) &&
                (lVar37 = cubicmap.width * local_2a0, (&prVar27[lVar41].r)[lVar37] == '\0')) &&
               ((&prVar27[lVar41].g)[lVar37] == '\0')) {
              if ((&prVar27[lVar41].b)[lVar37] == '\0') {
LAB_001473c3:
                lVar37 = (long)iVar36;
                *(float *)((long)pvVar28 + lVar37 * 0xc) = fVar44;
                *(float *)((long)pvVar28 + lVar37 * 0xc + 4) = fStack_64;
                *(float *)((long)pvVar28 + lVar37 * 0xc + 8) = fVar46;
                *(float *)((long)pvVar28 + lVar35 * 0xc + 0x9c) = fVar44;
                *(undefined4 *)((long)pvVar28 + lVar35 * 0xc + 0xa0) = 0;
                *(float *)((long)pvVar28 + lVar35 * 0xc + 0xa4) = fVar46;
                *(float *)((long)pvVar28 + lVar35 * 0xc + 0xa8) = local_68;
                *(float *)((long)pvVar28 + lVar35 * 0xc + 0xac) = fStack_64;
                *(float *)((long)pvVar28 + lVar35 * 0xc + 0xb0) = fVar46;
                *(float *)((long)pvVar28 + lVar35 * 0xc + 0xb4) = local_68;
                *(float *)((long)pvVar28 + lVar35 * 0xc + 0xb8) = fStack_64;
                *(float *)((long)pvVar28 + lVar35 * 0xc + 0xbc) = fVar46;
                *(float *)((long)pvVar28 + lVar35 * 0xc + 0xc0) = fVar44;
                *(undefined4 *)((long)pvVar28 + lVar35 * 0xc + 0xc4) = 0;
                *(float *)((long)pvVar28 + lVar35 * 0xc + 200) = fVar46;
                *(float *)((long)pvVar28 + lVar35 * 0xc + 0xcc) = local_68;
                *(undefined4 *)((long)pvVar28 + lVar35 * 0xc + 0xd0) = 0;
                *(float *)((long)pvVar28 + lVar35 * 0xc + 0xd4) = fVar46;
                iVar36 = iVar33 + 0x12;
                *(undefined4 *)((long)pvVar30 + (long)iVar34 * 0xc + 8) = 0xbf800000;
                *(undefined8 *)((long)pvVar30 + (long)iVar34 * 0xc) = 0;
                *(undefined4 *)((long)pvVar30 + lVar31 + 0xa4) = 0xbf800000;
                *(undefined8 *)((long)pvVar30 + lVar31 + 0x9c) = 0;
                *(undefined8 *)((long)pvVar30 + lVar31 + 0xa8) = 0;
                *(undefined4 *)((long)pvVar30 + lVar31 + 0xb0) = 0xbf800000;
                *(undefined8 *)((long)pvVar30 + lVar31 + 0xb4) = 0;
                *(undefined4 *)((long)pvVar30 + lVar31 + 0xbc) = 0xbf800000;
                *(undefined8 *)((long)pvVar30 + lVar31 + 0xc0) = 0;
                *(undefined4 *)((long)pvVar30 + lVar31 + 200) = 0xbf800000;
                *(undefined8 *)((long)pvVar30 + lVar31 + 0xcc) = 0;
                *(undefined4 *)((long)pvVar30 + lVar31 + 0xd4) = 0xbf800000;
                iVar34 = iVar25 + 0x12;
                *(undefined8 *)((long)pvVar29 + (long)iVar40 * 8) = 0;
                puVar1 = (undefined8 *)((long)pvVar29 + lVar42 * 8 + 0x68);
                *puVar1 = 0x3f00000000000000;
                puVar1[1] = 0x3f000000;
                puVar1 = (undefined8 *)((long)pvVar29 + lVar42 * 8 + 0x78);
                *puVar1 = 0x3f000000;
                puVar1[1] = 0x3f00000000000000;
                *(undefined8 *)((long)pvVar29 + lVar42 * 8 + 0x88) = 0x3f0000003f000000;
                iVar40 = iVar39 + 0x12;
              }
            }
            else if (local_2c8 == (long)cubicmap.height + -1) goto LAB_001473c3;
            if ((local_2c8 == 0) ||
               (((lVar31 = cubicmap.width * local_298, (&prVar27[lVar41].r)[lVar31] == '\0' &&
                 ((&prVar27[lVar41].g)[lVar31] == '\0')) && ((&prVar27[lVar41].b)[lVar31] == '\0')))
               ) {
              lVar31 = (long)iVar36;
              *(float *)((long)pvVar28 + lVar31 * 0xc) = fVar44;
              *(float *)((long)pvVar28 + lVar31 * 0xc + 4) = fStack_64;
              *(float *)((long)pvVar28 + lVar31 * 0xc + 8) = fVar45;
              *(float *)((long)pvVar28 + lVar31 * 0xc + 0xc) = local_68;
              *(undefined4 *)((long)pvVar28 + lVar31 * 0xc + 0x10) = 0;
              *(float *)((long)pvVar28 + lVar31 * 0xc + 0x14) = fVar45;
              *(float *)((long)pvVar28 + lVar31 * 0xc + 0x18) = fVar44;
              *(undefined4 *)((long)pvVar28 + lVar31 * 0xc + 0x1c) = 0;
              *(float *)((long)pvVar28 + lVar31 * 0xc + 0x20) = fVar45;
              *(float *)((long)pvVar28 + lVar31 * 0xc + 0x24) = fVar44;
              *(float *)((long)pvVar28 + lVar31 * 0xc + 0x28) = fStack_64;
              *(float *)((long)pvVar28 + lVar31 * 0xc + 0x2c) = fVar45;
              *(float *)((long)pvVar28 + lVar31 * 0xc + 0x30) = local_68;
              *(float *)((long)pvVar28 + lVar31 * 0xc + 0x34) = fStack_64;
              *(float *)((long)pvVar28 + lVar31 * 0xc + 0x38) = fVar45;
              *(float *)((long)pvVar28 + lVar31 * 0xc + 0x3c) = local_68;
              *(undefined4 *)((long)pvVar28 + lVar31 * 0xc + 0x40) = 0;
              *(float *)((long)pvVar28 + lVar31 * 0xc + 0x44) = fVar45;
              iVar36 = iVar36 + 6;
              lVar31 = (long)iVar34;
              *(undefined4 *)((long)pvVar30 + lVar31 * 0xc + 8) = 0x3f800000;
              *(undefined8 *)((long)pvVar30 + lVar31 * 0xc) = 0;
              *(undefined8 *)((long)pvVar30 + lVar31 * 0xc + 0xc) = 0;
              *(undefined4 *)((long)pvVar30 + lVar31 * 0xc + 0x14) = 0x3f800000;
              *(undefined8 *)((long)pvVar30 + lVar31 * 0xc + 0x18) = 0;
              *(undefined4 *)((long)pvVar30 + lVar31 * 0xc + 0x20) = 0x3f800000;
              *(undefined8 *)((long)pvVar30 + lVar31 * 0xc + 0x24) = 0;
              *(undefined4 *)((long)pvVar30 + lVar31 * 0xc + 0x2c) = 0x3f800000;
              *(undefined8 *)((long)pvVar30 + lVar31 * 0xc + 0x30) = 0;
              *(undefined4 *)((long)pvVar30 + lVar31 * 0xc + 0x38) = 0x3f800000;
              *(undefined8 *)((long)pvVar30 + lVar31 * 0xc + 0x3c) = 0;
              *(undefined4 *)((long)pvVar30 + lVar31 * 0xc + 0x44) = 0x3f800000;
              iVar34 = iVar34 + 6;
              lVar31 = (long)iVar40;
              puVar1 = (undefined8 *)((long)pvVar29 + lVar31 * 8);
              *puVar1 = 0x3f800000;
              puVar1[1] = 0x3f0000003f000000;
              puVar1 = (undefined8 *)((long)pvVar29 + lVar31 * 8 + 0x10);
              *puVar1 = 0x3f0000003f800000;
              puVar1[1] = 0x3f800000;
              puVar1 = (undefined8 *)((long)pvVar29 + lVar31 * 8 + 0x20);
              *puVar1 = 0x3f000000;
              puVar1[1] = 0x3f0000003f000000;
              iVar40 = iVar40 + 6;
            }
            lVar31 = (long)cubicmap.width;
            iVar39 = iVar40;
            if (((lVar41 < lVar31 + -1) &&
                (lVar35 = lVar38 * lVar31, (&prVar27[lVar41 + 1].r)[lVar35] == '\0')) &&
               ((&prVar27[lVar41 + 1].g)[lVar35] == '\0')) {
              if ((&prVar27[lVar41 + 1].b)[lVar35] == '\0') {
LAB_001476c3:
                lVar35 = (long)iVar36;
                *(float *)((long)pvVar28 + lVar35 * 0xc) = local_68;
                *(float *)((long)pvVar28 + lVar35 * 0xc + 4) = fStack_64;
                *(float *)((long)pvVar28 + lVar35 * 0xc + 8) = fVar46;
                *(float *)((long)pvVar28 + lVar35 * 0xc + 0xc) = local_68;
                *(undefined4 *)((long)pvVar28 + lVar35 * 0xc + 0x10) = 0;
                *(float *)((long)pvVar28 + lVar35 * 0xc + 0x14) = fVar46;
                *(float *)((long)pvVar28 + lVar35 * 0xc + 0x18) = local_68;
                *(float *)((long)pvVar28 + lVar35 * 0xc + 0x1c) = fStack_64;
                *(float *)((long)pvVar28 + lVar35 * 0xc + 0x20) = fVar45;
                *(float *)((long)pvVar28 + lVar35 * 0xc + 0x24) = local_68;
                *(float *)((long)pvVar28 + lVar35 * 0xc + 0x28) = fStack_64;
                *(float *)((long)pvVar28 + lVar35 * 0xc + 0x2c) = fVar45;
                *(float *)((long)pvVar28 + lVar35 * 0xc + 0x30) = local_68;
                *(undefined4 *)((long)pvVar28 + lVar35 * 0xc + 0x34) = 0;
                *(float *)((long)pvVar28 + lVar35 * 0xc + 0x38) = fVar46;
                *(float *)((long)pvVar28 + lVar35 * 0xc + 0x3c) = local_68;
                *(undefined4 *)((long)pvVar28 + lVar35 * 0xc + 0x40) = 0;
                *(float *)((long)pvVar28 + lVar35 * 0xc + 0x44) = fVar45;
                iVar36 = iVar36 + 6;
                lVar35 = (long)iVar34;
                *(undefined4 *)((long)pvVar30 + lVar35 * 0xc + 8) = 0;
                *(undefined8 *)((long)pvVar30 + lVar35 * 0xc) = 0x3f800000;
                *(undefined8 *)((long)pvVar30 + lVar35 * 0xc + 0xc) = 0x3f800000;
                *(undefined4 *)((long)pvVar30 + lVar35 * 0xc + 0x14) = 0;
                *(undefined8 *)((long)pvVar30 + lVar35 * 0xc + 0x18) = 0x3f800000;
                *(undefined4 *)((long)pvVar30 + lVar35 * 0xc + 0x20) = 0;
                *(undefined8 *)((long)pvVar30 + lVar35 * 0xc + 0x24) = 0x3f800000;
                *(undefined4 *)((long)pvVar30 + lVar35 * 0xc + 0x2c) = 0;
                *(undefined8 *)((long)pvVar30 + lVar35 * 0xc + 0x30) = 0x3f800000;
                *(undefined4 *)((long)pvVar30 + lVar35 * 0xc + 0x38) = 0;
                *(undefined8 *)((long)pvVar30 + lVar35 * 0xc + 0x3c) = 0x3f800000;
                *(undefined4 *)((long)pvVar30 + lVar35 * 0xc + 0x44) = 0;
                iVar34 = iVar34 + 6;
                lVar35 = (long)iVar40;
                puVar1 = (undefined8 *)((long)pvVar29 + lVar35 * 8);
                *puVar1 = 0;
                puVar1[1] = 0x3f00000000000000;
                puVar1 = (undefined8 *)((long)pvVar29 + lVar35 * 8 + 0x10);
                *puVar1 = 0x3f000000;
                puVar1[1] = 0x3f000000;
                puVar1 = (undefined8 *)((long)pvVar29 + lVar35 * 8 + 0x20);
                *puVar1 = 0x3f00000000000000;
                puVar1[1] = 0x3f0000003f000000;
                iVar39 = iVar40 + 6;
              }
            }
            else if (lVar41 == lVar31 + -1) goto LAB_001476c3;
            if ((lVar41 == 0) ||
               (((lVar31 = lVar31 * lVar38, iVar33 = iVar36, iVar25 = iVar34,
                 (&prVar27[lVar41 + -1].r)[lVar31] == '\0' &&
                 (*(char *)((long)prVar27 + lVar41 * 4 + lVar31 + -3) == '\0')) &&
                (*(char *)((long)prVar27 + lVar41 * 4 + lVar31 + -2) == '\0')))) {
              lVar31 = (long)iVar36;
              *(float *)((long)pvVar28 + lVar31 * 0xc) = fVar44;
              *(float *)((long)pvVar28 + lVar31 * 0xc + 4) = fStack_64;
              *(float *)((long)pvVar28 + lVar31 * 0xc + 8) = fVar45;
              *(float *)((long)pvVar28 + lVar31 * 0xc + 0xc) = fVar44;
              *(undefined4 *)((long)pvVar28 + lVar31 * 0xc + 0x10) = 0;
              *(float *)((long)pvVar28 + lVar31 * 0xc + 0x14) = fVar46;
              *(float *)((long)pvVar28 + lVar31 * 0xc + 0x18) = fVar44;
              *(float *)((long)pvVar28 + lVar31 * 0xc + 0x1c) = fStack_64;
              *(float *)((long)pvVar28 + lVar31 * 0xc + 0x20) = fVar46;
              *(float *)((long)pvVar28 + lVar31 * 0xc + 0x24) = fVar44;
              *(float *)((long)pvVar28 + lVar31 * 0xc + 0x28) = fStack_64;
              *(float *)((long)pvVar28 + lVar31 * 0xc + 0x2c) = fVar45;
              *(float *)((long)pvVar28 + lVar31 * 0xc + 0x30) = fVar44;
              *(undefined4 *)((long)pvVar28 + lVar31 * 0xc + 0x34) = 0;
              *(float *)((long)pvVar28 + lVar31 * 0xc + 0x38) = fVar45;
              *(float *)((long)pvVar28 + lVar31 * 0xc + 0x3c) = fVar44;
              *(undefined4 *)((long)pvVar28 + lVar31 * 0xc + 0x40) = 0;
              *(float *)((long)pvVar28 + lVar31 * 0xc + 0x44) = fVar46;
              lVar31 = (long)iVar34;
              *(undefined4 *)((long)pvVar30 + lVar31 * 0xc + 8) = 0;
              *(undefined8 *)((long)pvVar30 + lVar31 * 0xc) = 0xbf800000;
              *(undefined8 *)((long)pvVar30 + lVar31 * 0xc + 0xc) = 0xbf800000;
              *(undefined4 *)((long)pvVar30 + lVar31 * 0xc + 0x14) = 0;
              *(undefined8 *)((long)pvVar30 + lVar31 * 0xc + 0x18) = 0xbf800000;
              *(undefined4 *)((long)pvVar30 + lVar31 * 0xc + 0x20) = 0;
              *(undefined8 *)((long)pvVar30 + lVar31 * 0xc + 0x24) = 0xbf800000;
              *(undefined4 *)((long)pvVar30 + lVar31 * 0xc + 0x2c) = 0;
              *(undefined8 *)((long)pvVar30 + lVar31 * 0xc + 0x30) = 0xbf800000;
              *(undefined4 *)((long)pvVar30 + lVar31 * 0xc + 0x38) = 0;
              *(undefined8 *)((long)pvVar30 + lVar31 * 0xc + 0x3c) = 0xbf800000;
              *(undefined4 *)((long)pvVar30 + lVar31 * 0xc + 0x44) = 0;
              lVar31 = (long)iVar39;
              puVar1 = (undefined8 *)((long)pvVar29 + lVar31 * 8);
              *puVar1 = 0x3f000000;
              puVar1[1] = 0x3f0000003f800000;
              puVar1 = (undefined8 *)((long)pvVar29 + lVar31 * 8 + 0x10);
              *puVar1 = 0x3f800000;
              puVar1[1] = 0x3f000000;
              puVar1 = (undefined8 *)((long)pvVar29 + lVar31 * 8 + 0x20);
              *puVar1 = 0x3f0000003f000000;
              puVar1[1] = 0x3f0000003f800000;
              iVar39 = iVar39 + 6;
              iVar33 = iVar36 + 6;
              iVar25 = iVar34 + 6;
            }
          }
          lVar41 = lVar41 + 1;
        } while (cubicmap.width != lVar41);
      }
      local_2c8 = local_2c8 + 1;
      local_298 = local_298 + 4;
      local_2a0 = local_2a0 + 4;
      lVar38 = lVar38 + 4;
    } while (local_2c8 != cubicmap.height);
  }
  __return_storage_ptr__->vertex_count = iVar33;
  lVar38 = (long)iVar33;
  __return_storage_ptr__->triangle_count = iVar33 / 3;
  rVar7.proc_name = "rf_gen_mesh_cubicmap";
  rVar7.file_name =
       "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  rVar7.line_in_file = 0x8ac1;
  auVar22._8_8_ = (ulong)uStack_144 << 0x20;
  auVar22._0_8_ = (long)(iVar33 * 3) << 2;
  auVar22._16_8_ = 0;
  pfVar32 = (float *)(*local_40.allocator_proc)
                               (&local_40,rVar7,RF_AM_ALLOC,(rf_allocator_args)(auVar22 << 0x40));
  __return_storage_ptr__->vertices = pfVar32;
  rVar8.proc_name = "rf_gen_mesh_cubicmap";
  rVar8.file_name =
       "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  rVar8.line_in_file = 0x8ac2;
  auVar23._8_8_ = (ulong)uStack_174 << 0x20;
  auVar23._0_8_ = (long)__return_storage_ptr__->vertex_count * 0xc;
  auVar23._16_8_ = 0;
  pfVar32 = (float *)(*local_40.allocator_proc)
                               (&local_40,rVar8,RF_AM_ALLOC,(rf_allocator_args)(auVar23 << 0x40));
  __return_storage_ptr__->normals = pfVar32;
  rVar9.proc_name = "rf_gen_mesh_cubicmap";
  rVar9.file_name =
       "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  rVar9.line_in_file = 0x8ac3;
  auVar24._8_8_ = (ulong)uStack_1a4 << 0x20;
  auVar24._0_8_ = (long)__return_storage_ptr__->vertex_count << 3;
  auVar24._16_8_ = 0;
  pfVar32 = (float *)(*local_40.allocator_proc)
                               (&local_40,rVar9,RF_AM_ALLOC,(rf_allocator_args)(auVar24 << 0x40));
  __return_storage_ptr__->texcoords = pfVar32;
  __return_storage_ptr__->colors = (uchar *)0x0;
  if (0 < iVar33) {
    pfVar2 = __return_storage_ptr__->vertices;
    lVar41 = 8;
    do {
      *(undefined4 *)((long)pfVar2 + lVar41 + -8) = *(undefined4 *)((long)pvVar28 + lVar41 + -8);
      *(undefined4 *)((long)pfVar2 + lVar41 + -4) = *(undefined4 *)((long)pvVar28 + lVar41 + -4);
      *(undefined4 *)((long)pfVar2 + lVar41) = *(undefined4 *)((long)pvVar28 + lVar41);
      lVar41 = lVar41 + 0xc;
      lVar38 = lVar38 + -1;
    } while (lVar38 != 0);
  }
  if (0 < iVar25) {
    lVar38 = (long)iVar25;
    pfVar2 = __return_storage_ptr__->normals;
    lVar41 = 8;
    do {
      *(undefined4 *)((long)pfVar2 + lVar41 + -8) = *(undefined4 *)((long)pvVar30 + lVar41 + -8);
      *(undefined4 *)((long)pfVar2 + lVar41 + -4) = *(undefined4 *)((long)pvVar30 + lVar41 + -4);
      *(undefined4 *)((long)pfVar2 + lVar41) = *(undefined4 *)((long)pvVar30 + lVar41);
      lVar41 = lVar41 + 0xc;
      lVar38 = lVar38 + -1;
    } while (lVar38 != 0);
  }
  if (0 < iVar39) {
    lVar38 = 0;
    do {
      pfVar32[lVar38 * 2] = *(float *)((long)pvVar29 + lVar38 * 8);
      pfVar32[lVar38 * 2 + 1] = *(float *)((long)pvVar29 + lVar38 * 8 + 4);
      lVar38 = lVar38 + 1;
    } while (iVar39 != lVar38);
  }
  rVar10.proc_name = "rf_gen_mesh_cubicmap";
  rVar10.file_name =
       "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  rVar10.line_in_file = 0x8ae6;
  rVar15.size_to_allocate_or_reallocate = 0;
  rVar15.pointer_to_free_or_realloc = pvVar28;
  rVar15._16_8_ = (ulong)uStack_1d4 << 0x20;
  (*local_50.allocator_proc)(&local_50,rVar10,RF_AM_FREE,rVar15);
  rVar11.proc_name = "rf_gen_mesh_cubicmap";
  rVar11.file_name =
       "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  rVar11.line_in_file = 0x8ae7;
  rVar16.size_to_allocate_or_reallocate = 0;
  rVar16.pointer_to_free_or_realloc = pvVar30;
  rVar16._16_8_ = (ulong)uStack_204 << 0x20;
  (*local_50.allocator_proc)(&local_50,rVar11,RF_AM_FREE,rVar16);
  rVar12.proc_name = "rf_gen_mesh_cubicmap";
  rVar12.file_name =
       "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  rVar12.line_in_file = 0x8ae8;
  rVar17.size_to_allocate_or_reallocate = 0;
  rVar17.pointer_to_free_or_realloc = pvVar29;
  rVar17._16_8_ = (ulong)in_stack_fffffffffffffdcc << 0x20;
  (*local_50.allocator_proc)(&local_50,rVar12,RF_AM_FREE,rVar17);
  rVar13.proc_name = "rf_gen_mesh_cubicmap";
  rVar13.file_name =
       "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  rVar13.line_in_file = 0x8aea;
  rVar18.size_to_allocate_or_reallocate = 0;
  rVar18.pointer_to_free_or_realloc = prVar27;
  rVar18._16_8_ = (ulong)uStack_264 << 0x20;
  (*local_50.allocator_proc)(&local_50,rVar13,RF_AM_FREE,rVar18);
  rf_gfx_load_mesh(__return_storage_ptr__,false);
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_mesh rf_gen_mesh_cubicmap(rf_image cubicmap, rf_vec3 cube_size, rf_allocator allocator, rf_allocator temp_allocator)
{
    rf_mesh mesh = {0};
    mesh.vbo_id = (unsigned int*) RF_ALLOC(allocator, RF_MAX_MESH_VBO * sizeof(unsigned int));
    memset(mesh.vbo_id, 0, RF_MAX_MESH_VBO * sizeof(unsigned int));

    rf_color* cubicmap_pixels = rf_image_pixels_to_rgba32(cubicmap, temp_allocator);

    int map_width = cubicmap.width;
    int map_height = cubicmap.height;

    // NOTE: Max possible number of triangles numCubes*(12 triangles by cube)
    int maxTriangles = cubicmap.width*cubicmap.height*12;

    int vertex_pos_counter = 0; // Used to count vertices
    int vertex_texcoord_counter = 0; // Used to count texcoords
    int n_counter = 0; // Used to count normals

    float w = cube_size.x;
    float h = cube_size.z;
    float h2 = cube_size.y;

    rf_vec3* map_vertices  = (rf_vec3*) RF_ALLOC(temp_allocator, maxTriangles * 3 * sizeof(rf_vec3));
    rf_vec2 *map_texcoords = (rf_vec2*) RF_ALLOC(temp_allocator, maxTriangles * 3 * sizeof(rf_vec2));
    rf_vec3* map_normals   = (rf_vec3*) RF_ALLOC(temp_allocator, maxTriangles * 3 * sizeof(rf_vec3));

    // Define the 6 normals of the cube, we will combine them accordingly later...
    rf_vec3 n1 = {  1.0f,  0.0f,  0.0f };
    rf_vec3 n2 = { -1.0f,  0.0f,  0.0f };
    rf_vec3 n3 = {  0.0f,  1.0f,  0.0f };
    rf_vec3 n4 = {  0.0f, -1.0f,  0.0f };
    rf_vec3 n5 = {  0.0f,  0.0f,  1.0f };
    rf_vec3 n6 = {  0.0f,  0.0f, -1.0f };

    // NOTE: We use texture rectangles to define different textures for top-bottom-front-back-right-left (6)
    typedef struct rf_recf rf_recf;
    struct rf_recf
    {
        float x;
        float y;
        float width;
        float height;
    };

    rf_recf right_tex_uv  = { 0.0f, 0.0f, 0.5f, 0.5f };
    rf_recf left_tex_uv   = { 0.5f, 0.0f, 0.5f, 0.5f };
    rf_recf front_tex_uv  = { 0.0f, 0.0f, 0.5f, 0.5f };
    rf_recf back_tex_uv   = { 0.5f, 0.0f, 0.5f, 0.5f };
    rf_recf top_tex_uv    = { 0.0f, 0.5f, 0.5f, 0.5f };
    rf_recf bottom_tex_uv = { 0.5f, 0.5f, 0.5f, 0.5f };

    for (rf_int z = 0; z < map_height; ++z)
    {
        for (rf_int x = 0; x < map_width; ++x)
        {
            // Define the 8 vertex of the cube, we will combine them accordingly later...
            rf_vec3 v1 = {w * (x - 0.5f), h2, h * (z - 0.5f) };
            rf_vec3 v2 = {w * (x - 0.5f), h2, h * (z + 0.5f) };
            rf_vec3 v3 = {w * (x + 0.5f), h2, h * (z + 0.5f) };
            rf_vec3 v4 = {w * (x + 0.5f), h2, h * (z - 0.5f) };
            rf_vec3 v5 = {w * (x + 0.5f), 0, h * (z - 0.5f) };
            rf_vec3 v6 = {w * (x - 0.5f), 0, h * (z - 0.5f) };
            rf_vec3 v7 = {w * (x - 0.5f), 0, h * (z + 0.5f) };
            rf_vec3 v8 = {w * (x + 0.5f), 0, h * (z + 0.5f) };

            // We check pixel color to be RF_WHITE, we will full cubes
            if ((cubicmap_pixels[z*cubicmap.width + x].r == 255) &&
                (cubicmap_pixels[z*cubicmap.width + x].g == 255) &&
                (cubicmap_pixels[z*cubicmap.width + x].b == 255))
            {
                // Define triangles (Checking Collateral Cubes!)
                //----------------------------------------------

                // Define top triangles (2 tris, 6 vertex --> v1-v2-v3, v1-v3-v4)
                map_vertices[vertex_pos_counter] = v1;
                map_vertices[vertex_pos_counter + 1] = v2;
                map_vertices[vertex_pos_counter + 2] = v3;
                map_vertices[vertex_pos_counter + 3] = v1;
                map_vertices[vertex_pos_counter + 4] = v3;
                map_vertices[vertex_pos_counter + 5] = v4;
                vertex_pos_counter += 6;

                map_normals[n_counter] = n3;
                map_normals[n_counter + 1] = n3;
                map_normals[n_counter + 2] = n3;
                map_normals[n_counter + 3] = n3;
                map_normals[n_counter + 4] = n3;
                map_normals[n_counter + 5] = n3;
                n_counter += 6;

                map_texcoords[vertex_texcoord_counter] = (rf_vec2){top_tex_uv.x, top_tex_uv.y };
                map_texcoords[vertex_texcoord_counter + 1] = (rf_vec2){top_tex_uv.x, top_tex_uv.y + top_tex_uv.height };
                map_texcoords[vertex_texcoord_counter + 2] = (rf_vec2){top_tex_uv.x + top_tex_uv.width, top_tex_uv.y + top_tex_uv.height };
                map_texcoords[vertex_texcoord_counter + 3] = (rf_vec2){top_tex_uv.x, top_tex_uv.y };
                map_texcoords[vertex_texcoord_counter + 4] = (rf_vec2){top_tex_uv.x + top_tex_uv.width, top_tex_uv.y + top_tex_uv.height };
                map_texcoords[vertex_texcoord_counter + 5] = (rf_vec2){top_tex_uv.x + top_tex_uv.width, top_tex_uv.y };
                vertex_texcoord_counter += 6;

                // Define bottom triangles (2 tris, 6 vertex --> v6-v8-v7, v6-v5-v8)
                map_vertices[vertex_pos_counter] = v6;
                map_vertices[vertex_pos_counter + 1] = v8;
                map_vertices[vertex_pos_counter + 2] = v7;
                map_vertices[vertex_pos_counter + 3] = v6;
                map_vertices[vertex_pos_counter + 4] = v5;
                map_vertices[vertex_pos_counter + 5] = v8;
                vertex_pos_counter += 6;

                map_normals[n_counter] = n4;
                map_normals[n_counter + 1] = n4;
                map_normals[n_counter + 2] = n4;
                map_normals[n_counter + 3] = n4;
                map_normals[n_counter + 4] = n4;
                map_normals[n_counter + 5] = n4;
                n_counter += 6;

                map_texcoords[vertex_texcoord_counter] = (rf_vec2){bottom_tex_uv.x + bottom_tex_uv.width, bottom_tex_uv.y };
                map_texcoords[vertex_texcoord_counter + 1] = (rf_vec2){bottom_tex_uv.x, bottom_tex_uv.y + bottom_tex_uv.height };
                map_texcoords[vertex_texcoord_counter + 2] = (rf_vec2){bottom_tex_uv.x + bottom_tex_uv.width, bottom_tex_uv.y + bottom_tex_uv.height };
                map_texcoords[vertex_texcoord_counter + 3] = (rf_vec2){bottom_tex_uv.x + bottom_tex_uv.width, bottom_tex_uv.y };
                map_texcoords[vertex_texcoord_counter + 4] = (rf_vec2){bottom_tex_uv.x, bottom_tex_uv.y };
                map_texcoords[vertex_texcoord_counter + 5] = (rf_vec2){bottom_tex_uv.x, bottom_tex_uv.y + bottom_tex_uv.height };
                vertex_texcoord_counter += 6;

                if (((z < cubicmap.height - 1) &&
                     (cubicmap_pixels[(z + 1)*cubicmap.width + x].r == 0) &&
                     (cubicmap_pixels[(z + 1)*cubicmap.width + x].g == 0) &&
                     (cubicmap_pixels[(z + 1)*cubicmap.width + x].b == 0)) || (z == cubicmap.height - 1))
                {
                    // Define front triangles (2 tris, 6 vertex) --> v2 v7 v3, v3 v7 v8
                    // NOTE: Collateral occluded faces are not generated
                    map_vertices[vertex_pos_counter] = v2;
                    map_vertices[vertex_pos_counter + 1] = v7;
                    map_vertices[vertex_pos_counter + 2] = v3;
                    map_vertices[vertex_pos_counter + 3] = v3;
                    map_vertices[vertex_pos_counter + 4] = v7;
                    map_vertices[vertex_pos_counter + 5] = v8;
                    vertex_pos_counter += 6;

                    map_normals[n_counter] = n6;
                    map_normals[n_counter + 1] = n6;
                    map_normals[n_counter + 2] = n6;
                    map_normals[n_counter + 3] = n6;
                    map_normals[n_counter + 4] = n6;
                    map_normals[n_counter + 5] = n6;
                    n_counter += 6;

                    map_texcoords[vertex_texcoord_counter] = (rf_vec2){front_tex_uv.x, front_tex_uv.y };
                    map_texcoords[vertex_texcoord_counter + 1] = (rf_vec2){front_tex_uv.x, front_tex_uv.y + front_tex_uv.height };
                    map_texcoords[vertex_texcoord_counter + 2] = (rf_vec2){front_tex_uv.x + front_tex_uv.width, front_tex_uv.y };
                    map_texcoords[vertex_texcoord_counter + 3] = (rf_vec2){front_tex_uv.x + front_tex_uv.width, front_tex_uv.y };
                    map_texcoords[vertex_texcoord_counter + 4] = (rf_vec2){front_tex_uv.x, front_tex_uv.y + front_tex_uv.height };
                    map_texcoords[vertex_texcoord_counter + 5] = (rf_vec2){front_tex_uv.x + front_tex_uv.width, front_tex_uv.y + front_tex_uv.height };
                    vertex_texcoord_counter += 6;
                }

                if (((z > 0) &&
                     (cubicmap_pixels[(z - 1)*cubicmap.width + x].r == 0) &&
                     (cubicmap_pixels[(z - 1)*cubicmap.width + x].g == 0) &&
                     (cubicmap_pixels[(z - 1)*cubicmap.width + x].b == 0)) || (z == 0))
                {
                    // Define back triangles (2 tris, 6 vertex) --> v1 v5 v6, v1 v4 v5
                    // NOTE: Collateral occluded faces are not generated
                    map_vertices[vertex_pos_counter] = v1;
                    map_vertices[vertex_pos_counter + 1] = v5;
                    map_vertices[vertex_pos_counter + 2] = v6;
                    map_vertices[vertex_pos_counter + 3] = v1;
                    map_vertices[vertex_pos_counter + 4] = v4;
                    map_vertices[vertex_pos_counter + 5] = v5;
                    vertex_pos_counter += 6;

                    map_normals[n_counter] = n5;
                    map_normals[n_counter + 1] = n5;
                    map_normals[n_counter + 2] = n5;
                    map_normals[n_counter + 3] = n5;
                    map_normals[n_counter + 4] = n5;
                    map_normals[n_counter + 5] = n5;
                    n_counter += 6;

                    map_texcoords[vertex_texcoord_counter] = (rf_vec2){back_tex_uv.x + back_tex_uv.width, back_tex_uv.y };
                    map_texcoords[vertex_texcoord_counter + 1] = (rf_vec2){back_tex_uv.x, back_tex_uv.y + back_tex_uv.height };
                    map_texcoords[vertex_texcoord_counter + 2] = (rf_vec2){back_tex_uv.x + back_tex_uv.width, back_tex_uv.y + back_tex_uv.height };
                    map_texcoords[vertex_texcoord_counter + 3] = (rf_vec2){back_tex_uv.x + back_tex_uv.width, back_tex_uv.y };
                    map_texcoords[vertex_texcoord_counter + 4] = (rf_vec2){back_tex_uv.x, back_tex_uv.y };
                    map_texcoords[vertex_texcoord_counter + 5] = (rf_vec2){back_tex_uv.x, back_tex_uv.y + back_tex_uv.height };
                    vertex_texcoord_counter += 6;
                }

                if (((x < cubicmap.width - 1) &&
                     (cubicmap_pixels[z*cubicmap.width + (x + 1)].r == 0) &&
                     (cubicmap_pixels[z*cubicmap.width + (x + 1)].g == 0) &&
                     (cubicmap_pixels[z*cubicmap.width + (x + 1)].b == 0)) || (x == cubicmap.width - 1))
                {
                    // Define right triangles (2 tris, 6 vertex) --> v3 v8 v4, v4 v8 v5
                    // NOTE: Collateral occluded faces are not generated
                    map_vertices[vertex_pos_counter] = v3;
                    map_vertices[vertex_pos_counter + 1] = v8;
                    map_vertices[vertex_pos_counter + 2] = v4;
                    map_vertices[vertex_pos_counter + 3] = v4;
                    map_vertices[vertex_pos_counter + 4] = v8;
                    map_vertices[vertex_pos_counter + 5] = v5;
                    vertex_pos_counter += 6;

                    map_normals[n_counter] = n1;
                    map_normals[n_counter + 1] = n1;
                    map_normals[n_counter + 2] = n1;
                    map_normals[n_counter + 3] = n1;
                    map_normals[n_counter + 4] = n1;
                    map_normals[n_counter + 5] = n1;
                    n_counter += 6;

                    map_texcoords[vertex_texcoord_counter] = (rf_vec2){right_tex_uv.x, right_tex_uv.y };
                    map_texcoords[vertex_texcoord_counter + 1] = (rf_vec2){right_tex_uv.x, right_tex_uv.y + right_tex_uv.height };
                    map_texcoords[vertex_texcoord_counter + 2] = (rf_vec2){right_tex_uv.x + right_tex_uv.width, right_tex_uv.y };
                    map_texcoords[vertex_texcoord_counter + 3] = (rf_vec2){right_tex_uv.x + right_tex_uv.width, right_tex_uv.y };
                    map_texcoords[vertex_texcoord_counter + 4] = (rf_vec2){right_tex_uv.x, right_tex_uv.y + right_tex_uv.height };
                    map_texcoords[vertex_texcoord_counter + 5] = (rf_vec2){right_tex_uv.x + right_tex_uv.width, right_tex_uv.y + right_tex_uv.height };
                    vertex_texcoord_counter += 6;
                }

                if (((x > 0) &&
                     (cubicmap_pixels[z*cubicmap.width + (x - 1)].r == 0) &&
                     (cubicmap_pixels[z*cubicmap.width + (x - 1)].g == 0) &&
                     (cubicmap_pixels[z*cubicmap.width + (x - 1)].b == 0)) || (x == 0))
                {
                    // Define left triangles (2 tris, 6 vertex) --> v1 v7 v2, v1 v6 v7
                    // NOTE: Collateral occluded faces are not generated
                    map_vertices[vertex_pos_counter] = v1;
                    map_vertices[vertex_pos_counter + 1] = v7;
                    map_vertices[vertex_pos_counter + 2] = v2;
                    map_vertices[vertex_pos_counter + 3] = v1;
                    map_vertices[vertex_pos_counter + 4] = v6;
                    map_vertices[vertex_pos_counter + 5] = v7;
                    vertex_pos_counter += 6;

                    map_normals[n_counter] = n2;
                    map_normals[n_counter + 1] = n2;
                    map_normals[n_counter + 2] = n2;
                    map_normals[n_counter + 3] = n2;
                    map_normals[n_counter + 4] = n2;
                    map_normals[n_counter + 5] = n2;
                    n_counter += 6;

                    map_texcoords[vertex_texcoord_counter] = (rf_vec2){left_tex_uv.x, left_tex_uv.y };
                    map_texcoords[vertex_texcoord_counter + 1] = (rf_vec2){left_tex_uv.x + left_tex_uv.width, left_tex_uv.y + left_tex_uv.height };
                    map_texcoords[vertex_texcoord_counter + 2] = (rf_vec2){left_tex_uv.x + left_tex_uv.width, left_tex_uv.y };
                    map_texcoords[vertex_texcoord_counter + 3] = (rf_vec2){left_tex_uv.x, left_tex_uv.y };
                    map_texcoords[vertex_texcoord_counter + 4] = (rf_vec2){left_tex_uv.x, left_tex_uv.y + left_tex_uv.height };
                    map_texcoords[vertex_texcoord_counter + 5] = (rf_vec2){left_tex_uv.x + left_tex_uv.width, left_tex_uv.y + left_tex_uv.height };
                    vertex_texcoord_counter += 6;
                }
            }
                // We check pixel color to be RF_BLACK, we will only draw floor and roof
            else if ((cubicmap_pixels[z*cubicmap.width + x].r == 0) &&
                     (cubicmap_pixels[z*cubicmap.width + x].g == 0) &&
                     (cubicmap_pixels[z*cubicmap.width + x].b == 0))
            {
                // Define top triangles (2 tris, 6 vertex --> v1-v2-v3, v1-v3-v4)
                map_vertices[vertex_pos_counter] = v1;
                map_vertices[vertex_pos_counter + 1] = v3;
                map_vertices[vertex_pos_counter + 2] = v2;
                map_vertices[vertex_pos_counter + 3] = v1;
                map_vertices[vertex_pos_counter + 4] = v4;
                map_vertices[vertex_pos_counter + 5] = v3;
                vertex_pos_counter += 6;

                map_normals[n_counter] = n4;
                map_normals[n_counter + 1] = n4;
                map_normals[n_counter + 2] = n4;
                map_normals[n_counter + 3] = n4;
                map_normals[n_counter + 4] = n4;
                map_normals[n_counter + 5] = n4;
                n_counter += 6;

                map_texcoords[vertex_texcoord_counter] = (rf_vec2){top_tex_uv.x, top_tex_uv.y };
                map_texcoords[vertex_texcoord_counter + 1] = (rf_vec2){top_tex_uv.x + top_tex_uv.width, top_tex_uv.y + top_tex_uv.height };
                map_texcoords[vertex_texcoord_counter + 2] = (rf_vec2){top_tex_uv.x, top_tex_uv.y + top_tex_uv.height };
                map_texcoords[vertex_texcoord_counter + 3] = (rf_vec2){top_tex_uv.x, top_tex_uv.y };
                map_texcoords[vertex_texcoord_counter + 4] = (rf_vec2){top_tex_uv.x + top_tex_uv.width, top_tex_uv.y };
                map_texcoords[vertex_texcoord_counter + 5] = (rf_vec2){top_tex_uv.x + top_tex_uv.width, top_tex_uv.y + top_tex_uv.height };
                vertex_texcoord_counter += 6;

                // Define bottom triangles (2 tris, 6 vertex --> v6-v8-v7, v6-v5-v8)
                map_vertices[vertex_pos_counter] = v6;
                map_vertices[vertex_pos_counter + 1] = v7;
                map_vertices[vertex_pos_counter + 2] = v8;
                map_vertices[vertex_pos_counter + 3] = v6;
                map_vertices[vertex_pos_counter + 4] = v8;
                map_vertices[vertex_pos_counter + 5] = v5;
                vertex_pos_counter += 6;

                map_normals[n_counter] = n3;
                map_normals[n_counter + 1] = n3;
                map_normals[n_counter + 2] = n3;
                map_normals[n_counter + 3] = n3;
                map_normals[n_counter + 4] = n3;
                map_normals[n_counter + 5] = n3;
                n_counter += 6;

                map_texcoords[vertex_texcoord_counter] = (rf_vec2){bottom_tex_uv.x + bottom_tex_uv.width, bottom_tex_uv.y };
                map_texcoords[vertex_texcoord_counter + 1] = (rf_vec2){bottom_tex_uv.x + bottom_tex_uv.width, bottom_tex_uv.y + bottom_tex_uv.height };
                map_texcoords[vertex_texcoord_counter + 2] = (rf_vec2){bottom_tex_uv.x, bottom_tex_uv.y + bottom_tex_uv.height };
                map_texcoords[vertex_texcoord_counter + 3] = (rf_vec2){bottom_tex_uv.x + bottom_tex_uv.width, bottom_tex_uv.y };
                map_texcoords[vertex_texcoord_counter + 4] = (rf_vec2){bottom_tex_uv.x, bottom_tex_uv.y + bottom_tex_uv.height };
                map_texcoords[vertex_texcoord_counter + 5] = (rf_vec2){bottom_tex_uv.x, bottom_tex_uv.y };
                vertex_texcoord_counter += 6;
            }
        }
    }

    // Move data from map_vertices temp arays to vertices float array
    mesh.vertex_count = vertex_pos_counter;
    mesh.triangle_count = vertex_pos_counter/3;

    mesh.vertices  = (float*) RF_ALLOC(allocator, mesh.vertex_count * 3 * sizeof(float));
    mesh.normals   = (float*) RF_ALLOC(allocator, mesh.vertex_count * 3 * sizeof(float));
    mesh.texcoords = (float*) RF_ALLOC(allocator, mesh.vertex_count * 2 * sizeof(float));
    mesh.colors = NULL;

    int f_counter = 0;

    // Move vertices data
    for (rf_int i = 0; i < vertex_pos_counter; i++)
    {
        mesh.vertices[f_counter] = map_vertices[i].x;
        mesh.vertices[f_counter + 1] = map_vertices[i].y;
        mesh.vertices[f_counter + 2] = map_vertices[i].z;
        f_counter += 3;
    }

    f_counter = 0;

    // Move normals data
    for (rf_int i = 0; i < n_counter; i++)
    {
        mesh.normals[f_counter] = map_normals[i].x;
        mesh.normals[f_counter + 1] = map_normals[i].y;
        mesh.normals[f_counter + 2] = map_normals[i].z;
        f_counter += 3;
    }

    f_counter = 0;

    // Move texcoords data
    for (rf_int i = 0; i < vertex_texcoord_counter; i++)
    {
        mesh.texcoords[f_counter] = map_texcoords[i].x;
        mesh.texcoords[f_counter + 1] = map_texcoords[i].y;
        f_counter += 2;
    }

    RF_FREE(temp_allocator, map_vertices);
    RF_FREE(temp_allocator, map_normals);
    RF_FREE(temp_allocator, map_texcoords);

    RF_FREE(temp_allocator, cubicmap_pixels); // Free image pixel data

    // Upload vertex data to GPU (static mesh)
    rf_gfx_load_mesh(&mesh, false);

    return mesh;
}